

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  byte bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  AABBNodeMB4D *node1;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive *prim;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  undefined1 (*local_24b0) [16];
  long local_24a8;
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar10;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  local_24b0 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx((undefined1  [16])aVar2,auVar28);
  auVar30._8_4_ = 0x219392ef;
  auVar30._0_8_ = 0x219392ef219392ef;
  auVar30._12_4_ = 0x219392ef;
  auVar28 = vcmpps_avx(auVar28,auVar30,1);
  auVar28 = vblendvps_avx((undefined1  [16])aVar2,auVar30,auVar28);
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar30 = vrcpps_avx(auVar28);
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar28 = vfnmadd231ps_fma(auVar31,auVar30,auVar28);
  auVar29 = vfmadd132ps_fma(auVar28,auVar30,auVar30);
  local_2420 = auVar29._0_4_;
  auVar28 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar1));
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  auVar30 = vmovshdup_avx(auVar29);
  local_2440 = auVar30._0_8_;
  uStack_2438 = local_2440;
  uStack_2430 = local_2440;
  uStack_2428 = local_2440;
  auVar27 = vshufpd_avx(auVar29,auVar29,1);
  auVar31 = vshufps_avx(auVar29,auVar29,0xaa);
  local_2460 = auVar31._0_8_;
  uStack_2458 = local_2460;
  uStack_2450 = local_2460;
  uStack_2448 = local_2460;
  auVar37._0_4_ = local_2420 * (ray->super_RayK<1>).org.field_0.m128[0];
  auVar37._4_4_ = auVar29._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
  auVar37._8_4_ = auVar29._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
  auVar37._12_4_ = auVar29._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
  auVar31 = vmovshdup_avx(auVar37);
  auVar29 = vshufps_avx(auVar37,auVar37,0xaa);
  uVar16 = (ulong)(local_2420 < 0.0) << 5;
  uVar17 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
  uVar19 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
  uVar18 = uVar16 ^ 0x20;
  uVar14 = uVar17 ^ 0x20;
  uVar26 = auVar28._0_4_;
  auVar21._4_4_ = uVar26;
  auVar21._0_4_ = uVar26;
  auVar21._8_4_ = uVar26;
  auVar21._12_4_ = uVar26;
  auVar21._16_4_ = uVar26;
  auVar21._20_4_ = uVar26;
  auVar21._24_4_ = uVar26;
  auVar21._28_4_ = uVar26;
  local_2480 = -auVar37._0_4_;
  fStack_247c = -auVar37._0_4_;
  fStack_2478 = -auVar37._0_4_;
  fStack_2474 = -auVar37._0_4_;
  fStack_2470 = -auVar37._0_4_;
  fStack_246c = -auVar37._0_4_;
  fStack_2468 = -auVar37._0_4_;
  fStack_2464 = -auVar37._0_4_;
  uVar9 = auVar31._0_4_;
  uVar34 = auVar31._4_4_;
  local_23c0._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
  local_23c0._8_4_ = uVar9 ^ 0x80000000;
  local_23c0._12_4_ = uVar34 ^ 0x80000000;
  local_23c0._16_4_ = uVar9 ^ 0x80000000;
  local_23c0._20_4_ = uVar34 ^ 0x80000000;
  local_23c0._24_4_ = uVar9 ^ 0x80000000;
  local_23c0._28_4_ = uVar34 ^ 0x80000000;
  auVar39 = ZEXT3264(local_23c0);
  uVar9 = auVar29._0_4_;
  uVar34 = auVar29._4_4_;
  local_23e0._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
  local_23e0._8_4_ = uVar9 ^ 0x80000000;
  local_23e0._12_4_ = uVar34 ^ 0x80000000;
  local_23e0._16_4_ = uVar9 ^ 0x80000000;
  local_23e0._20_4_ = uVar34 ^ 0x80000000;
  local_23e0._24_4_ = uVar9 ^ 0x80000000;
  local_23e0._28_4_ = uVar34 ^ 0x80000000;
  auVar40 = ZEXT3264(local_23e0);
  uVar26 = auVar22._0_4_;
  local_2400._4_4_ = uVar26;
  local_2400._0_4_ = uVar26;
  local_2400._8_4_ = uVar26;
  local_2400._12_4_ = uVar26;
  local_2400._16_4_ = uVar26;
  local_2400._20_4_ = uVar26;
  local_2400._24_4_ = uVar26;
  local_2400._28_4_ = uVar26;
  auVar41 = ZEXT3264(local_2400);
  local_24d0 = uVar17;
  local_24c8 = uVar16;
  local_24c0 = ray;
  local_24b8 = context;
  do {
    auVar25 = ZEXT464((uint)fVar1);
    auVar36 = ZEXT3264(CONCAT428(fStack_2404,
                                 CONCAT424(fStack_2408,
                                           CONCAT420(fStack_240c,
                                                     CONCAT416(fStack_2410,
                                                               CONCAT412(fStack_2414,
                                                                         CONCAT48(fStack_2418,
                                                                                  CONCAT44(
                                                  fStack_241c,local_2420))))))));
    auVar38 = ZEXT3264(CONCAT824(uStack_2428,CONCAT816(uStack_2430,CONCAT88(uStack_2438,local_2440))
                                ));
    auVar35 = ZEXT3264(CONCAT824(uStack_2448,CONCAT816(uStack_2450,CONCAT88(uStack_2458,local_2460))
                                ));
    auVar33 = ZEXT3264(CONCAT428(fStack_2464,
                                 CONCAT424(fStack_2468,
                                           CONCAT420(fStack_246c,
                                                     CONCAT416(fStack_2470,
                                                               CONCAT412(fStack_2474,
                                                                         CONCAT48(fStack_2478,
                                                                                  CONCAT44(
                                                  fStack_247c,local_2480))))))));
LAB_015363e1:
    do {
      if (local_24b0 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar12 = local_24b0 + -1;
      local_24b0 = local_24b0 + -1;
    } while (auVar25._0_4_ < *(float *)(*pauVar12 + 8));
    uVar13 = *(ulong *)*local_24b0;
LAB_01536405:
    if ((uVar13 & 8) == 0) {
      uVar7 = uVar13 & 0xfffffffffffffff0;
      uVar26 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
      auVar24._4_4_ = uVar26;
      auVar24._0_4_ = uVar26;
      auVar24._8_4_ = uVar26;
      auVar24._12_4_ = uVar26;
      auVar24._16_4_ = uVar26;
      auVar24._20_4_ = uVar26;
      auVar24._24_4_ = uVar26;
      auVar24._28_4_ = uVar26;
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar16),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + uVar16));
      auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar36._0_32_,auVar33._0_32_);
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar17),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + uVar17));
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar38._0_32_,auVar39._0_32_);
      auVar5 = vpmaxsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar22));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar19),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + uVar19));
      auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar35._0_32_,auVar40._0_32_);
      auVar6 = vpmaxsd_avx2(ZEXT1632(auVar28),auVar41._0_32_);
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar18),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + uVar18));
      local_24a0 = vpmaxsd_avx2(auVar5,auVar6);
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + uVar14),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + uVar14));
      auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar36._0_32_,auVar33._0_32_);
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar38._0_32_,auVar39._0_32_);
      auVar5 = vpminsd_avx2(ZEXT1632(auVar28),ZEXT1632(auVar22));
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar7 + 0x100 + (uVar19 ^ 0x20)),auVar24,
                                *(undefined1 (*) [32])(uVar7 + 0x40 + (uVar19 ^ 0x20)));
      auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar35._0_32_,auVar40._0_32_);
      auVar6 = vpminsd_avx2(ZEXT1632(auVar28),auVar21);
      auVar5 = vpminsd_avx2(auVar5,auVar6);
      auVar5 = vcmpps_avx(local_24a0,auVar5,2);
      if (((uint)uVar13 & 7) == 6) {
        auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar7 + 0x1c0),auVar24,2);
        auVar24 = vcmpps_avx(auVar24,*(undefined1 (*) [32])(uVar7 + 0x1e0),1);
        auVar6 = vandps_avx(auVar6,auVar24);
        auVar5 = vandps_avx(auVar6,auVar5);
        auVar28 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
      }
      else {
        auVar28 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
      }
      auVar28 = vpsllw_avx(auVar28,0xf);
      if ((((((((auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0'
         ) {
        auVar28 = vpacksswb_avx(auVar28,auVar28);
        bVar4 = SUB161(auVar28 >> 7,0) & 1 | (SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar28 >> 0x17,0) & 1) << 2 | (SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar28 >> 0x27,0) & 1) << 4 | (SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar28 >> 0x37,0) & 1) << 6 | SUB161(auVar28 >> 0x3f,0) << 7;
        lVar8 = 0;
        for (uVar13 = (ulong)bVar4; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          lVar8 = lVar8 + 1;
        }
        uVar13 = *(ulong *)(uVar7 + lVar8 * 8);
        uVar9 = bVar4 - 1 & (uint)bVar4;
        uVar10 = (ulong)uVar9;
        if (uVar9 != 0) {
          uVar34 = *(uint *)(local_24a0 + lVar8 * 4);
          lVar8 = 0;
          for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar9 = uVar9 - 1 & uVar9;
          uVar11 = (ulong)uVar9;
          uVar10 = *(ulong *)(uVar7 + lVar8 * 8);
          uVar3 = *(uint *)(local_24a0 + lVar8 * 4);
          if (uVar9 == 0) {
            if (uVar34 < uVar3) {
              *(ulong *)*local_24b0 = uVar10;
              *(uint *)(*local_24b0 + 8) = uVar3;
              local_24b0 = local_24b0 + 1;
            }
            else {
              *(ulong *)*local_24b0 = uVar13;
              *(uint *)(*local_24b0 + 8) = uVar34;
              local_24b0 = local_24b0 + 1;
              uVar13 = uVar10;
            }
          }
          else {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = uVar13;
            auVar28 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar34));
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar10;
            auVar22 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar3));
            lVar8 = 0;
            for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
            uVar9 = uVar9 - 1 & uVar9;
            uVar13 = (ulong)uVar9;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)(uVar7 + lVar8 * 8);
            auVar31 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
            auVar30 = vpcmpgtd_avx(auVar22,auVar28);
            if (uVar9 == 0) {
              auVar27 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar22,auVar28,auVar27);
              auVar28 = vblendvps_avx(auVar28,auVar22,auVar27);
              auVar22 = vpcmpgtd_avx(auVar31,auVar30);
              auVar27 = vpshufd_avx(auVar22,0xaa);
              auVar22 = vblendvps_avx(auVar31,auVar30,auVar27);
              auVar30 = vblendvps_avx(auVar30,auVar31,auVar27);
              auVar31 = vpcmpgtd_avx(auVar30,auVar28);
              auVar27 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar30,auVar28,auVar27);
              auVar28 = vblendvps_avx(auVar28,auVar30,auVar27);
              *local_24b0 = auVar28;
              local_24b0[1] = auVar31;
              uVar13 = auVar22._0_8_;
              pauVar12 = local_24b0 + 2;
            }
            else {
              lVar8 = 0;
              for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar8 = lVar8 + 1;
              }
              uVar9 = uVar9 - 1 & uVar9;
              uVar13 = (ulong)uVar9;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(uVar7 + lVar8 * 8);
              auVar27 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
              if (uVar9 == 0) {
                auVar29 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar22,auVar28,auVar29);
                auVar28 = vblendvps_avx(auVar28,auVar22,auVar29);
                auVar22 = vpcmpgtd_avx(auVar27,auVar31);
                auVar29 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar27,auVar31,auVar29);
                auVar31 = vblendvps_avx(auVar31,auVar27,auVar29);
                auVar27 = vpcmpgtd_avx(auVar31,auVar28);
                auVar29 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar31,auVar28,auVar29);
                auVar28 = vblendvps_avx(auVar28,auVar31,auVar29);
                auVar31 = vpcmpgtd_avx(auVar22,auVar30);
                auVar29 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar22,auVar30,auVar29);
                auVar22 = vblendvps_avx(auVar30,auVar22,auVar29);
                auVar30 = vpcmpgtd_avx(auVar27,auVar22);
                auVar29 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar27,auVar22,auVar29);
                auVar22 = vblendvps_avx(auVar22,auVar27,auVar29);
                *local_24b0 = auVar28;
                local_24b0[1] = auVar22;
                local_24b0[2] = auVar30;
                uVar13 = auVar31._0_8_;
                pauVar12 = local_24b0 + 3;
                auVar35 = ZEXT3264(CONCAT824(uStack_2448,
                                             CONCAT816(uStack_2450,CONCAT88(uStack_2458,local_2460))
                                            ));
              }
              else {
                *local_24b0 = auVar28;
                local_24b0[1] = auVar22;
                local_24b0[2] = auVar31;
                pauVar12 = local_24b0 + 3;
                local_24b0[3] = auVar27;
                do {
                  lVar8 = 0;
                  for (uVar17 = uVar13; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000
                      ) {
                    lVar8 = lVar8 + 1;
                  }
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = *(ulong *)(uVar7 + lVar8 * 8);
                  auVar28 = vpunpcklqdq_avx(auVar23,ZEXT416(*(uint *)(local_24a0 + lVar8 * 4)));
                  pauVar12[1] = auVar28;
                  pauVar12 = pauVar12 + 1;
                  uVar13 = uVar13 - 1 & uVar13;
                } while (uVar13 != 0);
                lVar8 = 0;
                while (pauVar12 != local_24b0) {
                  auVar28 = local_24b0[1];
                  uVar9 = vextractps_avx(auVar28,2);
                  for (lVar15 = 0x10;
                      (lVar8 != lVar15 && (*(uint *)(local_24b0[-1] + lVar15 + 8) < uVar9));
                      lVar15 = lVar15 + -0x10) {
                    *(undefined1 (*) [16])(*local_24b0 + lVar15) =
                         *(undefined1 (*) [16])(local_24b0[-1] + lVar15);
                  }
                  *(undefined1 (*) [16])(*local_24b0 + lVar15) = auVar28;
                  lVar8 = lVar8 + -0x10;
                  local_24b0 = local_24b0 + 1;
                }
                uVar13 = *(ulong *)*pauVar12;
                auVar36 = ZEXT3264(CONCAT428(fStack_2404,
                                             CONCAT424(fStack_2408,
                                                       CONCAT420(fStack_240c,
                                                                 CONCAT416(fStack_2410,
                                                                           CONCAT412(fStack_2414,
                                                                                     CONCAT48(
                                                  fStack_2418,CONCAT44(fStack_241c,local_2420)))))))
                                  );
                auVar38 = ZEXT3264(CONCAT824(uStack_2428,
                                             CONCAT816(uStack_2430,CONCAT88(uStack_2438,local_2440))
                                            ));
                auVar35 = ZEXT3264(CONCAT824(uStack_2448,
                                             CONCAT816(uStack_2450,CONCAT88(uStack_2458,local_2460))
                                            ));
                uVar17 = local_24d0;
              }
            }
            auVar33 = ZEXT3264(CONCAT428(fStack_2464,
                                         CONCAT424(fStack_2468,
                                                   CONCAT420(fStack_246c,
                                                             CONCAT416(fStack_2470,
                                                                       CONCAT412(fStack_2474,
                                                                                 CONCAT48(
                                                  fStack_2478,CONCAT44(fStack_247c,local_2480)))))))
                              );
            local_24b0 = pauVar12;
          }
        }
        goto LAB_01536405;
      }
      auVar28 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                       ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
      auVar25 = ZEXT1664(auVar28);
      goto LAB_015363e1;
    }
    local_24a8 = (ulong)((uint)uVar13 & 0xf) - 8;
    prim = (Primitive *)(uVar13 & 0xfffffffffffffff0);
    while (bVar20 = local_24a8 != 0, local_24a8 = local_24a8 + -1, bVar20) {
      InstanceArrayIntersector1MB::intersect(&local_24d1,ray,local_24b8,prim);
      auVar41 = ZEXT3264(local_2400);
      auVar40 = ZEXT3264(local_23e0);
      auVar39 = ZEXT3264(local_23c0);
      prim = prim + 1;
      ray = local_24c0;
      uVar16 = local_24c8;
      uVar17 = local_24d0;
    }
    fVar1 = (ray->super_RayK<1>).tfar;
    auVar21._4_4_ = fVar1;
    auVar21._0_4_ = fVar1;
    auVar21._8_4_ = fVar1;
    auVar21._12_4_ = fVar1;
    auVar21._16_4_ = fVar1;
    auVar21._20_4_ = fVar1;
    auVar21._24_4_ = fVar1;
    auVar21._28_4_ = fVar1;
    fVar1 = (ray->super_RayK<1>).tfar;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }